

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,double number,UnicodeString *appendTo,FieldPositionIterator *posIter,
          UErrorCode *status)

{
  bool bVar1;
  int32_t offset;
  LocalizedNumberFormatter *status_00;
  undefined1 local_68 [8];
  UnicodeStringAppendable appendable;
  undefined1 local_48 [8];
  FormattedNumber output;
  UErrorCode *status_local;
  FieldPositionIterator *posIter_local;
  UnicodeString *appendTo_local;
  double number_local;
  DecimalFormat *this_local;
  
  output._8_8_ = status;
  if ((posIter != (FieldPositionIterator *)0x0) ||
     (bVar1 = fastFormatDouble(this,number,appendTo), !bVar1)) {
    status_00 = LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>::operator->
                          (&(this->fields->formatter).
                            super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>);
    icu_63::number::LocalizedNumberFormatter::formatDouble
              ((LocalizedNumberFormatter *)local_48,number,(UErrorCode *)status_00);
    offset = UnicodeString::length(appendTo);
    fieldPositionIteratorHelper
              ((FormattedNumber *)local_48,posIter,offset,(UErrorCode *)output._8_8_);
    UnicodeStringAppendable::UnicodeStringAppendable((UnicodeStringAppendable *)local_68,appendTo);
    icu_63::number::FormattedNumber::appendTo((FormattedNumber *)local_48,(Appendable *)local_68);
    UnicodeStringAppendable::~UnicodeStringAppendable((UnicodeStringAppendable *)local_68);
    icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_48);
  }
  return appendTo;
}

Assistant:

UnicodeString&
DecimalFormat::format(double number, UnicodeString& appendTo, FieldPositionIterator* posIter,
                      UErrorCode& status) const {
    if (posIter == nullptr && fastFormatDouble(number, appendTo)) {
        return appendTo;
    }
    FormattedNumber output = fields->formatter->formatDouble(number, status);
    fieldPositionIteratorHelper(output, posIter, appendTo.length(), status);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}